

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
AddNestedExtensions(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *filename,
                   DescriptorProto *message_type,pair<const_void_*,_int> value)

{
  int iVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  bool bVar4;
  Type *message_type_00;
  Type *field;
  int i;
  int iVar5;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  
  iVar5 = 0;
  do {
    auVar2 = value._0_12_;
    if ((message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_ <= iVar5) {
      iVar5 = 0;
      do {
        iVar1 = (message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
        bVar3 = iVar1 <= iVar5;
        if (iVar1 <= iVar5) {
          return bVar3;
        }
        field = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&(message_type->extension_).super_RepeatedPtrFieldBase,iVar5);
        value_01._12_4_ = 0;
        value_01.first = (void *)auVar2._0_8_;
        value_01.second = auVar2._8_4_;
        bVar4 = AddExtension(this,filename,field,value_01);
        iVar5 = iVar5 + 1;
      } while (bVar4);
      return bVar3;
    }
    message_type_00 =
         internal::RepeatedPtrFieldBase::
         Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                   (&(message_type->nested_type_).super_RepeatedPtrFieldBase,iVar5);
    value_00._12_4_ = 0;
    value_00.first = (void *)auVar2._0_8_;
    value_00.second = auVar2._8_4_;
    bVar3 = AddNestedExtensions(this,filename,message_type_00,value_00);
    iVar5 = iVar5 + 1;
  } while (bVar3);
  return false;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}